

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-chunk.c
# Opt level: O1

_Bool chunk_list_remove(char *name)

{
  chunk_conflict **ppcVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  _Bool _Var6;
  
  ppcVar1 = chunk_list;
  uVar5 = (uint)chunk_list_max;
  _Var6 = uVar5 != 0;
  if (_Var6) {
    iVar2 = strcmp(name,(*chunk_list)->name);
    if (iVar2 == 0) {
      uVar4 = 1;
      uVar3 = 0;
    }
    else {
      uVar4 = 1;
      do {
        uVar3 = uVar4;
        if (uVar5 == uVar3) {
          return uVar3 < uVar5;
        }
        uVar4 = uVar3 + 1;
        iVar2 = strcmp(name,ppcVar1[uVar3]->name);
      } while (iVar2 != 0);
      _Var6 = uVar3 < uVar5;
    }
    if ((int)uVar3 + 1U < uVar5) {
      do {
        chunk_list[uVar3] = chunk_list[uVar4];
        uVar4 = uVar4 + 1;
        uVar3 = uVar3 + 1;
      } while (uVar5 - 1 != uVar3);
    }
    chunk_list_max = (uint16_t)(uVar5 - 1);
    chunk_list[uVar5 - 1 & 0xffff] = (chunk_conflict *)0x0;
  }
  return _Var6;
}

Assistant:

bool chunk_list_remove(const char *name)
{
	int i;

	/* Find the match */
	for (i = 0; i < chunk_list_max; i++) {
		if (streq(name, chunk_list[i]->name)) {
			/* Copy all the succeeding chunks back one */
			int j;
			for (j = i + 1; j < chunk_list_max; j++) {
				chunk_list[j - 1] = chunk_list[j];
			}

			/* Shorten the list and return */
			chunk_list_max--;
			chunk_list[chunk_list_max] = NULL;
			return true;
		}
	}

	return false;
}